

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_SecureChannelManager_cleanupTimedOut(UA_SecureChannelManager *cm,UA_DateTime nowMonotonic)

{
  channel_list_entry *pcVar1;
  uint local_44;
  UA_DateTime timeout;
  channel_list_entry *temp;
  channel_list_entry *entry;
  UA_DateTime nowMonotonic_local;
  UA_SecureChannelManager *cm_local;
  
  pcVar1 = (cm->channels).lh_first;
  while (temp = pcVar1, temp != (channel_list_entry *)0x0) {
    pcVar1 = (temp->pointers).le_next;
    if (((long)((temp->channel).securityToken.createdAt +
               (ulong)(temp->channel).securityToken.revisedLifetime * 10000) < nowMonotonic) ||
       ((temp->channel).connection == (UA_Connection *)0x0)) {
      if ((temp->channel).connection == (UA_Connection *)0x0) {
        local_44 = 0;
      }
      else {
        local_44 = ((temp->channel).connection)->sockfd;
      }
      UA_LOG_INFO((cm->server->config).logger,UA_LOGCATEGORY_SECURECHANNEL,
                  "Connection %i | SecureChannel %i | SecureChannel has timed out",(ulong)local_44,
                  (ulong)(temp->channel).securityToken.channelId);
      removeSecureChannel(cm,temp);
    }
    else if ((temp->channel).nextSecurityToken.tokenId != 0) {
      UA_SecureChannel_revolveTokens(&temp->channel);
    }
  }
  return;
}

Assistant:

void
UA_SecureChannelManager_cleanupTimedOut(UA_SecureChannelManager *cm, UA_DateTime nowMonotonic) {
    channel_list_entry *entry, *temp;
    LIST_FOREACH_SAFE(entry, &cm->channels, pointers, temp) {
        UA_DateTime timeout = entry->channel.securityToken.createdAt +
            (UA_DateTime)(entry->channel.securityToken.revisedLifetime * UA_MSEC_TO_DATETIME);
        if(timeout < nowMonotonic || !entry->channel.connection) {
            UA_LOG_INFO_CHANNEL(cm->server->config.logger, &entry->channel,
                                "SecureChannel has timed out");
            removeSecureChannel(cm, entry);
        } else if(entry->channel.nextSecurityToken.tokenId > 0) {
            UA_SecureChannel_revolveTokens(&entry->channel);
        }
    }
}